

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O2

void __thiscall
glslang::TType::deepCopy
          (TType *this,TType *copyOf,
          TMap<glslang::TVector<glslang::TTypeLoc>_*,_glslang::TVector<glslang::TTypeLoc>_*,_std::less<glslang::TVector<glslang::TTypeLoc>_*>_>
          *copiedMap)

{
  anon_union_8_2_8ac53c11_for_TType_13 *__k;
  TSourceLoc *pTVar1;
  pointer pTVar2;
  int iVar3;
  uint uVar4;
  TSpirvDecorate *this_00;
  TSpirvType *pTVar5;
  TArraySizes *pTVar6;
  TTypeParameters *pTVar7;
  iterator iVar8;
  TString *pTVar9;
  TVector<glslang::TTypeLoc> *this_01;
  mapped_type *ppTVar10;
  TType *this_02;
  ulong uVar11;
  TSpirvDecorate *from;
  anon_union_8_2_8ac53c11_for_TType_13 *s;
  value_type *__x;
  TTypeLoc typeLoc;
  
  from = (TSpirvDecorate *)copyOf;
  shallowCopy(this,copyOf);
  if ((copyOf->qualifier).spirvDecorate != (TSpirvDecorate *)0x0) {
    this_00 = (TSpirvDecorate *)TSpirvDecorate::operator_new((TSpirvDecorate *)0xa8,(size_t)from);
    TSpirvDecorate::TSpirvDecorate(this_00);
    (this->qualifier).spirvDecorate = this_00;
    from = (copyOf->qualifier).spirvDecorate;
    TSpirvDecorate::operator=(this_00,from);
  }
  if (copyOf->spirvType != (TSpirvType *)0x0) {
    pTVar5 = (TSpirvType *)TSpirvType::operator_new((TSpirvType *)0x50,(size_t)from);
    TSpirvType::TSpirvType(pTVar5);
    this->spirvType = pTVar5;
    from = (TSpirvDecorate *)copyOf->spirvType;
    TSpirvType::operator=(pTVar5,(TSpirvType *)from);
  }
  if (copyOf->arraySizes != (TArraySizes *)0x0) {
    pTVar6 = (TArraySizes *)TArraySizes::operator_new((TArraySizes *)0x18,(size_t)from);
    (pTVar6->sizes)._vptr_TSmallArrayVector = (_func_int **)&PTR__TSmallArrayVector_0089abd8;
    (pTVar6->sizes).sizes = (TVector<glslang::TArraySize> *)0x0;
    pTVar6->implicitArraySize = 0;
    pTVar6->implicitlySized = true;
    pTVar6->variablyIndexed = false;
    this->arraySizes = pTVar6;
    from = (TSpirvDecorate *)copyOf->arraySizes;
    TArraySizes::operator=(pTVar6,(TArraySizes *)from);
  }
  if (copyOf->typeParameters != (TTypeParameters *)0x0) {
    pTVar7 = (TTypeParameters *)TTypeParameters::operator_new((TTypeParameters *)0x18,(size_t)from);
    pTVar7->basicType = EbtVoid;
    pTVar7->arraySizes = (TArraySizes *)0x0;
    pTVar7->spirvType = (TSpirvType *)0x0;
    this->typeParameters = pTVar7;
    pTVar6 = (TArraySizes *)TArraySizes::operator_new((TArraySizes *)0x18,(size_t)from);
    (pTVar6->sizes)._vptr_TSmallArrayVector = (_func_int **)&PTR__TSmallArrayVector_0089abd8;
    (pTVar6->sizes).sizes = (TVector<glslang::TArraySize> *)0x0;
    pTVar6->implicitArraySize = 0;
    pTVar6->implicitlySized = true;
    pTVar6->variablyIndexed = false;
    this->typeParameters->arraySizes = pTVar6;
    TArraySizes::operator=(pTVar6,copyOf->typeParameters->arraySizes);
    pTVar5 = copyOf->typeParameters->spirvType;
    if (pTVar5 != (TSpirvType *)0x0) {
      TSpirvType::operator=(this->typeParameters->spirvType,pTVar5);
    }
    this->typeParameters->basicType = (uint)(byte)copyOf->field_0x8;
  }
  iVar3 = (*copyOf->_vptr_TType[0x25])(copyOf);
  if (((char)iVar3 != '\0') && ((copyOf->field_13).structure != (TTypeList *)0x0)) {
    __k = &copyOf->field_13;
    s = __k;
    iVar8 = std::
            _Rb_tree<glslang::TVector<glslang::TTypeLoc>_*,_std::pair<glslang::TVector<glslang::TTypeLoc>_*const,_glslang::TVector<glslang::TTypeLoc>_*>,_std::_Select1st<std::pair<glslang::TVector<glslang::TTypeLoc>_*const,_glslang::TVector<glslang::TTypeLoc>_*>_>,_std::less<glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<glslang::TVector<glslang::TTypeLoc>_*const,_glslang::TVector<glslang::TTypeLoc>_*>_>_>
            ::find((_Rb_tree<glslang::TVector<glslang::TTypeLoc>_*,_std::pair<glslang::TVector<glslang::TTypeLoc>_*const,_glslang::TVector<glslang::TTypeLoc>_*>,_std::_Select1st<std::pair<glslang::TVector<glslang::TTypeLoc>_*const,_glslang::TVector<glslang::TTypeLoc>_*>_>,_std::less<glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<glslang::TVector<glslang::TTypeLoc>_*const,_glslang::TVector<glslang::TTypeLoc>_*>_>_>
                    *)copiedMap,&__k->structure);
    if ((_Rb_tree_header *)iVar8._M_node ==
        &(copiedMap->
         super_map<glslang::TVector<glslang::TTypeLoc>_*,_glslang::TVector<glslang::TTypeLoc>_*,_std::less<glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<glslang::TVector<glslang::TTypeLoc>_*const,_glslang::TVector<glslang::TTypeLoc>_*>_>_>
         )._M_t._M_impl.super__Rb_tree_header) {
      this_01 = (TVector<glslang::TTypeLoc> *)
                TVector<glslang::TTypeLoc>::operator_new
                          ((TVector<glslang::TTypeLoc> *)0x20,(size_t)s);
      TVector<glslang::TTypeLoc>::TVector(this_01);
      (this->field_13).structure = this_01;
      __x = (value_type *)__k;
      ppTVar10 = std::
                 map<glslang::TVector<glslang::TTypeLoc>_*,_glslang::TVector<glslang::TTypeLoc>_*,_std::less<glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<glslang::TVector<glslang::TTypeLoc>_*const,_glslang::TVector<glslang::TTypeLoc>_*>_>_>
                 ::operator[](&copiedMap->
                               super_map<glslang::TVector<glslang::TTypeLoc>_*,_glslang::TVector<glslang::TTypeLoc>_*,_std::less<glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<glslang::TVector<glslang::TTypeLoc>_*const,_glslang::TVector<glslang::TTypeLoc>_*>_>_>
                              ,&__k->structure);
      *ppTVar10 = this_01;
      uVar4 = 0;
      while( true ) {
        uVar11 = (ulong)uVar4;
        pTVar2 = (__k->structure->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(__k->structure->
                          super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                          ).
                          super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 5) <= uVar11)
        break;
        typeLoc.loc.column = pTVar2[uVar11].loc.column;
        typeLoc.loc._20_4_ = *(undefined4 *)&pTVar2[uVar11].loc.field_0x14;
        pTVar1 = &pTVar2[uVar11].loc;
        typeLoc.loc.name = pTVar1->name;
        typeLoc.loc.string = pTVar1->string;
        typeLoc.loc.line = pTVar1->line;
        this_02 = (TType *)operator_new((TType *)0x98,(size_t)__x);
        TType(this_02,EbtVoid,EvqTemporary,1,0,0,false);
        typeLoc.type = this_02;
        deepCopy(this_02,(__k->structure->
                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                         ).
                         super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar11].type,copiedMap);
        __x = &typeLoc;
        std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::push_back
                  (&((this->field_13).structure)->
                    super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>,__x
                  );
        uVar4 = uVar4 + 1;
      }
    }
    else {
      this->field_13 = (anon_union_8_2_8ac53c11_for_TType_13)iVar8._M_node[1]._M_parent;
    }
  }
  if (copyOf->fieldName != (TString *)0x0) {
    pTVar9 = NewPoolTString_abi_cxx11_((copyOf->fieldName->_M_dataplus)._M_p);
    this->fieldName = pTVar9;
  }
  if (copyOf->typeName != (TString *)0x0) {
    pTVar9 = NewPoolTString_abi_cxx11_((copyOf->typeName->_M_dataplus)._M_p);
    this->typeName = pTVar9;
  }
  return;
}

Assistant:

void deepCopy(const TType& copyOf, TMap<TTypeList*,TTypeList*>& copiedMap)
    {
        shallowCopy(copyOf);

        // GL_EXT_spirv_intrinsics
        if (copyOf.qualifier.spirvDecorate) {
            qualifier.spirvDecorate = new TSpirvDecorate;
            *qualifier.spirvDecorate = *copyOf.qualifier.spirvDecorate;
        }

        if (copyOf.spirvType) {
            spirvType = new TSpirvType;
            *spirvType = *copyOf.spirvType;
        }

        if (copyOf.arraySizes) {
            arraySizes = new TArraySizes;
            *arraySizes = *copyOf.arraySizes;
        }

        if (copyOf.typeParameters) {
            typeParameters = new TTypeParameters;
            typeParameters->arraySizes = new TArraySizes;
            *typeParameters->arraySizes = *copyOf.typeParameters->arraySizes;
            if (copyOf.typeParameters->spirvType) {
                *typeParameters->spirvType = *copyOf.typeParameters->spirvType;
            }
            typeParameters->basicType = copyOf.basicType;
        }

        if (copyOf.isStruct() && copyOf.structure) {
            auto prevCopy = copiedMap.find(copyOf.structure);
            if (prevCopy != copiedMap.end())
                structure = prevCopy->second;
            else {
                structure = new TTypeList;
                copiedMap[copyOf.structure] = structure;
                for (unsigned int i = 0; i < copyOf.structure->size(); ++i) {
                    TTypeLoc typeLoc;
                    typeLoc.loc = (*copyOf.structure)[i].loc;
                    typeLoc.type = new TType();
                    typeLoc.type->deepCopy(*(*copyOf.structure)[i].type, copiedMap);
                    structure->push_back(typeLoc);
                }
            }
        }

        if (copyOf.fieldName)
            fieldName = NewPoolTString(copyOf.fieldName->c_str());
        if (copyOf.typeName)
            typeName = NewPoolTString(copyOf.typeName->c_str());
    }